

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O3

Result __thiscall spectest::CommandRunner::Run(CommandRunner *this,Script *script)

{
  pointer puVar1;
  AssertTrapCommand *command_00;
  Result RVar2;
  CommandPtr *command;
  pointer puVar3;
  
  std::__cxx11::string::_M_assign((string *)&this->source_filename_);
  puVar3 = (script->commands).
           super__Vector_base<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>,_std::allocator<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (script->commands).
           super__Vector_base<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>,_std::allocator<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar3 == puVar1) {
      return (Result)Ok;
    }
    command_00 = (AssertTrapCommand *)
                 (puVar3->_M_t).
                 super___uniq_ptr_impl<spectest::Command,_std::default_delete<spectest::Command>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_spectest::Command_*,_std::default_delete<spectest::Command>_>
                 .super__Head_base<0UL,_spectest::Command_*,_false>._M_head_impl;
    switch(*(CommandType *)((long)&command_00->super_CommandMixin<(wabt::CommandType)8> + 8)) {
    case First:
      OnModuleCommand(this,(ModuleCommand *)command_00);
      goto switchD_0016efc7_default;
    case Action:
      RVar2 = OnActionCommand(this,(ActionCommand *)command_00);
      break;
    case Register:
      OnRegisterCommand(this,(RegisterCommand *)command_00);
      goto switchD_0016efc7_default;
    case AssertMalformed:
      RVar2 = OnAssertMalformedCommand(this,(AssertMalformedCommand *)command_00);
      break;
    case AssertInvalid:
      RVar2 = OnAssertInvalidCommand(this,(AssertInvalidCommand *)command_00);
      break;
    case AssertUnlinkable:
      RVar2 = OnAssertUnlinkableCommand(this,(AssertUnlinkableCommand *)command_00);
      break;
    case AssertUninstantiable:
      RVar2 = OnAssertUninstantiableCommand(this,(AssertUninstantiableCommand *)command_00);
      break;
    case AssertReturn:
      RVar2 = OnAssertReturnCommand(this,(AssertReturnCommand *)command_00);
      break;
    case AssertTrap:
      RVar2 = OnAssertTrapCommand(this,command_00);
      break;
    case AssertExhaustion:
      RVar2 = OnAssertExhaustionCommand(this,(AssertExhaustionCommand *)command_00);
      break;
    default:
      goto switchD_0016efc7_default;
    }
    if (RVar2.enum_ == Ok) {
      this->passed_ = this->passed_ + 1;
    }
    this->total_ = this->total_ + 1;
switchD_0016efc7_default:
    puVar3 = puVar3 + 1;
  } while( true );
}

Assistant:

wabt::Result CommandRunner::Run(const Script& script) {
  source_filename_ = script.filename;

  for (const CommandPtr& command : script.commands) {
    switch (command->type) {
      case CommandType::Module:
        OnModuleCommand(cast<ModuleCommand>(command.get()));
        break;

      case CommandType::Action:
        TallyCommand(OnActionCommand(cast<ActionCommand>(command.get())));
        break;

      case CommandType::Register:
        OnRegisterCommand(cast<RegisterCommand>(command.get()));
        break;

      case CommandType::AssertMalformed:
        TallyCommand(OnAssertMalformedCommand(
            cast<AssertMalformedCommand>(command.get())));
        break;

      case CommandType::AssertInvalid:
        TallyCommand(
            OnAssertInvalidCommand(cast<AssertInvalidCommand>(command.get())));
        break;

      case CommandType::AssertUnlinkable:
        TallyCommand(OnAssertUnlinkableCommand(
            cast<AssertUnlinkableCommand>(command.get())));
        break;

      case CommandType::AssertUninstantiable:
        TallyCommand(OnAssertUninstantiableCommand(
            cast<AssertUninstantiableCommand>(command.get())));
        break;

      case CommandType::AssertReturn:
        TallyCommand(
            OnAssertReturnCommand(cast<AssertReturnCommand>(command.get())));
        break;

      case CommandType::AssertTrap:
        TallyCommand(
            OnAssertTrapCommand(cast<AssertTrapCommand>(command.get())));
        break;

      case CommandType::AssertExhaustion:
        TallyCommand(OnAssertExhaustionCommand(
            cast<AssertExhaustionCommand>(command.get())));
        break;
    }
  }

  return wabt::Result::Ok;
}